

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_extension(lysp_ctx *ctx,lysp_stmt *stmt,lysp_ext **extensions)

{
  ly_stmt lVar1;
  LY_ERR LVar2;
  lysp_ext *ex_00;
  char *pcVar3;
  char *pcVar4;
  ly_ctx *local_88;
  ly_ctx *local_78;
  ly_ctx *local_70;
  ly_ctx *local_68;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  lysp_stmt *child;
  LY_ERR ret___1;
  LY_ERR ret__;
  char *p__;
  lysp_ext *ex;
  lysp_ext **extensions_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  if (*extensions == (lysp_ext *)0x0) {
    _ret___1 = (undefined8 *)malloc(0x40);
    if (_ret___1 == (undefined8 *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        local_70 = (ly_ctx *)0x0;
      }
      else {
        local_70 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(local_70,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_extension");
      return LY_EMEM;
    }
    *_ret___1 = 1;
  }
  else {
    (*extensions)[-1].compiled = (lysc_ext *)((long)&((*extensions)[-1].compiled)->name + 1);
    _ret___1 = (undefined8 *)
               realloc(&(*extensions)[-1].compiled,(long)(*extensions)[-1].compiled * 0x38 + 8);
    if (_ret___1 == (undefined8 *)0x0) {
      (*extensions)[-1].compiled = (lysc_ext *)&(*extensions)[-1].compiled[-1].field_0x2f;
      if (ctx == (lysp_ctx *)0x0) {
        local_68 = (ly_ctx *)0x0;
      }
      else {
        local_68 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(local_68,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_extension");
      return LY_EMEM;
    }
  }
  *extensions = (lysp_ext *)(_ret___1 + 1);
  ex_00 = *extensions + (long)&(*extensions)[-1].compiled[-1].field_0x2f;
  memset(ex_00,0,0x38);
  ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    if (ctx == (lysp_ctx *)0x0) {
      local_78 = (ly_ctx *)0x0;
    }
    else {
      local_78 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ctx_local._4_4_ = lydict_insert(local_78,stmt->arg,0,&ex_00->name);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      for (_ret___3 = stmt->child; _ret___3 != (lysp_stmt *)0x0; _ret___3 = _ret___3->next) {
        lVar1 = _ret___3->kw;
        if (lVar1 == LY_STMT_ARGUMENT) {
          LVar2 = lysp_stmt_argument(ctx,_ret___3,ex_00);
        }
        else if (lVar1 == LY_STMT_DESCRIPTION) {
          LVar2 = lysp_stmt_text_field(ctx,_ret___3,0,&ex_00->dsc,Y_STR_ARG,&ex_00->exts);
        }
        else if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
          LVar2 = lysp_stmt_ext(ctx,_ret___3,stmt->kw,0,&ex_00->exts);
        }
        else if (lVar1 == LY_STMT_REFERENCE) {
          LVar2 = lysp_stmt_text_field(ctx,_ret___3,0,&ex_00->ref,Y_STR_ARG,&ex_00->exts);
        }
        else {
          if (lVar1 != LY_STMT_STATUS) {
            if (ctx == (lysp_ctx *)0x0) {
              local_88 = (ly_ctx *)0x0;
            }
            else {
              local_88 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar3 = lyplg_ext_stmt2str(_ret___3->kw);
            pcVar4 = lyplg_ext_stmt2str(LY_STMT_EXTENSION);
            ly_vlog(local_88,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,pcVar4);
            return LY_EVALID;
          }
          LVar2 = lysp_stmt_status(ctx,_ret___3,&ex_00->flags,&ex_00->exts);
        }
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_extension(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_ext **extensions)
{
    struct lysp_ext *ex;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *extensions, ex, LY_EMEM);

    /* store name */
    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &ex->name));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &ex->dsc, Y_STR_ARG, &ex->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &ex->ref, Y_STR_ARG, &ex->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &ex->flags, &ex->exts));
            break;
        case LY_STMT_ARGUMENT:
            LY_CHECK_RET(lysp_stmt_argument(ctx, child, ex));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &ex->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(LY_STMT_EXTENSION));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}